

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O2

int main(void)

{
  vector<double,_std::allocator<double>_> numbers;
  string in;
  
  numbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  prompt_filename_abi_cxx11_(&in,(FileType *)&numbers);
  read_numbers(&numbers,&in);
  print_numbers(&numbers);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&numbers.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&in);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto in = prompt_filename(FileType::in);
		auto numbers = read_numbers(in);
		print_numbers(numbers);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << '\n';
		return -1;
	}
	catch (...)
	{
		std::cerr << "Unknown exception occured.\n";
		return -2;
	}
}